

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * zdd_subset1_aux(DdManager *zdd,DdNode *P,DdNode *zvar)

{
  DdNode *T;
  DdNode *E;
  DdNode *empty;
  DdNode *e;
  DdNode *t;
  DdNode *res;
  int level;
  int top_var;
  DdNode *zvar_local;
  DdNode *P_local;
  DdManager *zdd_local;
  
  t = zdd->zero;
  zdd_local = (DdManager *)cuddCacheLookup2Zdd(zdd,zdd_subset1_aux,P,zvar);
  if (zdd_local == (DdManager *)0x0) {
    if (P->index == 0x7fffffff) {
      cuddCacheInsert2(zdd,zdd_subset1_aux,P,zvar,t);
      zdd_local = (DdManager *)t;
    }
    else {
      if (zdd->permZ[P->index] <= zdd->permZ[zvar->index]) {
        if (zdd->permZ[P->index] == zdd->permZ[zvar->index]) {
          t = (P->type).kids.T;
        }
        else {
          T = zdd_subset1_aux(zdd,(P->type).kids.T,zvar);
          if (T == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
          E = zdd_subset1_aux(zdd,(P->type).kids.E,zvar);
          if (E == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(zdd,T);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
          t = cuddZddGetNode(zdd,P->index,T,E);
          if (t == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(zdd,T);
            Cudd_RecursiveDerefZdd(zdd,E);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
        }
      }
      cuddCacheInsert2(zdd,zdd_subset1_aux,P,zvar,t);
      zdd_local = (DdManager *)t;
    }
  }
  return &zdd_local->sentinel;
}

Assistant:

static DdNode *
zdd_subset1_aux(
  DdManager * zdd,
  DdNode * P,
  DdNode * zvar)
{
    int         top_var, level;
    DdNode      *res, *t, *e;
    DdNode      *empty;

    statLine(zdd);
    empty = DD_ZERO(zdd);

    /* Check cache. */
    res = cuddCacheLookup2Zdd(zdd, zdd_subset1_aux, P, zvar);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P)) {
        res = empty;
        cuddCacheInsert2(zdd, zdd_subset1_aux, P, zvar, res);
        return(res);
    }

    top_var = zdd->permZ[P->index];
    level = zdd->permZ[zvar->index];

    if (top_var > level) {
        res = empty;
    } else if (top_var == level) {
        res = cuddT(P);
    } else {
        t = zdd_subset1_aux(zdd, cuddT(P), zvar);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = zdd_subset1_aux(zdd, cuddE(P), zvar);
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            Cudd_RecursiveDerefZdd(zdd, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(zdd, zdd_subset1_aux, P, zvar, res);

    return(res);

}